

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_enc.c
# Opt level: O0

int WebPPictureInitInternal(WebPPicture *picture,int version)

{
  int in_ESI;
  WebPPicture *in_RDI;
  int local_4;
  
  if (in_ESI >> 8 == 2) {
    if (in_RDI != (WebPPicture *)0x0) {
      memset(in_RDI,0,0x100);
      in_RDI->writer = DummyWriter;
      WebPEncodingSetError(in_RDI,VP8_ENC_OK);
    }
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int WebPPictureInitInternal(WebPPicture* picture, int version) {
  if (WEBP_ABI_IS_INCOMPATIBLE(version, WEBP_ENCODER_ABI_VERSION)) {
    return 0;   // caller/system version mismatch!
  }
  if (picture != NULL) {
    memset(picture, 0, sizeof(*picture));
    picture->writer = DummyWriter;
    WebPEncodingSetError(picture, VP8_ENC_OK);
  }
  return 1;
}